

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O1

UBool utrie_setRange32_63(UNewTrie *trie,UChar32 start,UChar32 limit,uint32_t value,UBool overwrite)

{
  uint32_t uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint32_t *puVar5;
  long lVar6;
  long lVar7;
  uint32_t *puVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (trie == (UNewTrie *)0x0) {
    return '\0';
  }
  uVar11 = (ulong)(uint)start;
  if ((((start <= limit) && ((uint)limit < 0x110001)) && ((uint)start < 0x110000)) &&
     (trie->isCompacted == '\0')) {
    if (start == limit) {
      return '\x01';
    }
    puVar8 = trie->data;
    uVar1 = *puVar8;
    uVar12 = start & 0x1f;
    if (uVar12 != 0) {
      uVar4 = trie->index[(uint)start >> 5];
      uVar9 = uVar4;
      if ((long)(int)uVar4 < 1) {
        uVar9 = trie->dataLength;
        iVar2 = uVar9 + 0x20;
        uVar10 = 0xffffffff;
        if (iVar2 <= trie->dataCapacity) {
          trie->dataLength = iVar2;
          uVar10 = uVar9;
        }
        uVar9 = 0xffffffff;
        if (-1 < (int)uVar10) {
          trie->index[(uint)start >> 5] = uVar10;
          puVar5 = puVar8 + -(long)(int)uVar4;
          puVar8 = puVar8 + uVar10;
          for (lVar6 = 0x20; uVar9 = uVar10, lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar8 = *puVar5;
            puVar5 = puVar5 + 1;
            puVar8 = puVar8 + 1;
          }
        }
      }
      if ((int)uVar9 < 0) {
        bVar3 = false;
        uVar4 = 0;
      }
      else {
        uVar4 = start + 0x20U & 0x3fffe0;
        puVar8 = trie->data;
        if (limit < (int)uVar4) {
          uVar10 = limit & 0x1f;
          puVar5 = puVar8 + (ulong)uVar9 + (ulong)uVar12;
          uVar4 = 1;
          if (overwrite == '\0') {
            if (uVar12 < uVar10) {
              do {
                if (*puVar5 == uVar1) {
                  *puVar5 = value;
                }
                puVar5 = puVar5 + 1;
              } while (puVar5 < puVar8 + (ulong)uVar9 + (ulong)uVar10);
            }
          }
          else if (uVar12 < uVar10) {
            do {
              *puVar5 = value;
              puVar5 = puVar5 + 1;
            } while (puVar5 < puVar8 + (ulong)uVar9 + (ulong)uVar10);
          }
          bVar3 = false;
        }
        else {
          uVar11 = (ulong)(uVar12 << 2) - 4;
          if (overwrite == '\0') {
            do {
              if (*(uint32_t *)((long)puVar8 + uVar11 + (ulong)uVar9 * 4 + 4) == uVar1) {
                *(uint32_t *)((long)puVar8 + uVar11 + (ulong)uVar9 * 4 + 4) = value;
              }
              uVar11 = uVar11 + 4;
            } while (uVar11 < 0x7c);
          }
          else {
            do {
              *(uint32_t *)((long)puVar8 + uVar11 + (ulong)uVar9 * 4 + 4) = value;
              uVar11 = uVar11 + 4;
            } while (uVar11 < 0x7c);
          }
          bVar3 = true;
          uVar11 = (ulong)uVar4;
        }
      }
      if (!bVar3) {
        return (UBool)uVar4;
      }
    }
    if ((int)uVar11 < (int)(limit & 0x1fffe0U)) {
      uVar12 = -(uint)(uVar1 != value);
      do {
        uVar13 = uVar11 >> 5;
        iVar2 = trie->index[uVar13];
        lVar6 = (long)iVar2;
        puVar8 = trie->data;
        if (lVar6 < 1) {
          if ((puVar8[(uint)-iVar2] != value) && (overwrite != '\0' || iVar2 == 0)) {
            if ((int)uVar12 < 0) {
              uVar12 = trie->dataLength;
              iVar2 = uVar12 + 0x20;
              uVar4 = 0xffffffff;
              if (iVar2 <= trie->dataCapacity) {
                trie->dataLength = iVar2;
                uVar4 = uVar12;
              }
              uVar12 = 0xffffffff;
              if (-1 < (int)uVar4) {
                trie->index[uVar13] = uVar4;
                puVar5 = puVar8 + -lVar6;
                puVar8 = puVar8 + uVar4;
                for (lVar7 = 0x20; uVar12 = uVar4, lVar7 != 0; lVar7 = lVar7 + -1) {
                  *puVar8 = *puVar5;
                  puVar5 = puVar5 + 1;
                  puVar8 = puVar8 + 1;
                }
              }
              if ((int)uVar12 < 0) {
                return '\0';
              }
              trie->index[uVar13] = -uVar12;
              puVar8 = trie->data;
              uVar13 = 0xfffffffffffffffc;
              do {
                *(uint32_t *)((long)puVar8 + uVar13 + (ulong)uVar12 * 4 + 4) = value;
                uVar13 = uVar13 + 4;
              } while (uVar13 < 0x7c);
            }
            else {
              trie->index[uVar13] = -uVar12;
            }
          }
        }
        else {
          uVar13 = 0xfffffffffffffffc;
          if (overwrite == '\0') {
            do {
              if (*(uint32_t *)((long)puVar8 + uVar13 + lVar6 * 4 + 4) == uVar1) {
                *(uint32_t *)((long)puVar8 + uVar13 + lVar6 * 4 + 4) = value;
              }
              uVar13 = uVar13 + 4;
            } while (uVar13 < 0x7c);
          }
          else {
            do {
              *(uint32_t *)((long)puVar8 + uVar13 + lVar6 * 4 + 4) = value;
              uVar13 = uVar13 + 4;
            } while (uVar13 < 0x7c);
          }
        }
        uVar11 = uVar11 + 0x20;
      } while ((int)uVar11 < (int)(limit & 0x1fffe0U));
    }
    if ((limit & 0x1fU) != 0) {
      uVar11 = uVar11 >> 5 & 0x7ffffff;
      uVar12 = trie->index[uVar11];
      uVar4 = uVar12;
      if ((long)(int)uVar12 < 1) {
        uVar4 = trie->dataLength;
        iVar2 = uVar4 + 0x20;
        uVar9 = 0xffffffff;
        if (iVar2 <= trie->dataCapacity) {
          trie->dataLength = iVar2;
          uVar9 = uVar4;
        }
        uVar4 = 0xffffffff;
        if (-1 < (int)uVar9) {
          trie->index[uVar11] = uVar9;
          puVar8 = trie->data + -(long)(int)uVar12;
          puVar5 = trie->data + uVar9;
          for (lVar6 = 0x20; uVar4 = uVar9, lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar5 = *puVar8;
            puVar8 = puVar8 + 1;
            puVar5 = puVar5 + 1;
          }
        }
      }
      if ((int)uVar4 < 0) {
        return '\0';
      }
      puVar5 = trie->data + uVar4;
      puVar8 = puVar5 + (limit & 0x1fU);
      if (overwrite == '\0') {
        do {
          if (*puVar5 == uVar1) {
            *puVar5 = value;
          }
          puVar5 = puVar5 + 1;
        } while (puVar5 < puVar8);
      }
      else {
        do {
          *puVar5 = value;
          puVar5 = puVar5 + 1;
        } while (puVar5 < puVar8);
      }
    }
    return '\x01';
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_setRange32(UNewTrie *trie, UChar32 start, UChar32 limit, uint32_t value, UBool overwrite) {
    /*
     * repeat value in [start..limit[
     * mark index values for repeat-data blocks by setting bit 31 of the index values
     * fill around existing values if any, if(overwrite)
     */
    uint32_t initialValue;
    int32_t block, rest, repeatBlock;

    /* valid, uncompacted trie and valid indexes? */
    if( trie==NULL || trie->isCompacted ||
        (uint32_t)start>0x10ffff || (uint32_t)limit>0x110000 || start>limit
    ) {
        return FALSE;
    }
    if(start==limit) {
        return TRUE; /* nothing to do */
    }

    initialValue=trie->data[0];
    if(start&UTRIE_MASK) {
        UChar32 nextStart;

        /* set partial block at [start..following block boundary[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        nextStart=(start+UTRIE_DATA_BLOCK_LENGTH)&~UTRIE_MASK;
        if(nextStart<=limit) {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, UTRIE_DATA_BLOCK_LENGTH,
                            value, initialValue, overwrite);
            start=nextStart;
        } else {
            utrie_fillBlock(trie->data+block, start&UTRIE_MASK, limit&UTRIE_MASK,
                            value, initialValue, overwrite);
            return TRUE;
        }
    }

    /* number of positions in the last, partial block */
    rest=limit&UTRIE_MASK;

    /* round down limit to a block boundary */
    limit&=~UTRIE_MASK;

    /* iterate over all-value blocks */
    if(value==initialValue) {
        repeatBlock=0;
    } else {
        repeatBlock=-1;
    }
    while(start<limit) {
        /* get index value */
        block=trie->index[start>>UTRIE_SHIFT];
        if(block>0) {
            /* already allocated, fill in value */
            utrie_fillBlock(trie->data+block, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, overwrite);
        } else if(trie->data[-block]!=value && (block==0 || overwrite)) {
            /* set the repeatBlock instead of the current block 0 or range block */
            if(repeatBlock>=0) {
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
            } else {
                /* create and set and fill the repeatBlock */
                repeatBlock=utrie_getDataBlock(trie, start);
                if(repeatBlock<0) {
                    return FALSE;
                }

                /* set the negative block number to indicate that it is a repeat block */
                trie->index[start>>UTRIE_SHIFT]=-repeatBlock;
                utrie_fillBlock(trie->data+repeatBlock, 0, UTRIE_DATA_BLOCK_LENGTH, value, initialValue, TRUE);
            }
        }

        start+=UTRIE_DATA_BLOCK_LENGTH;
    }

    if(rest>0) {
        /* set partial block at [last block boundary..limit[ */
        block=utrie_getDataBlock(trie, start);
        if(block<0) {
            return FALSE;
        }

        utrie_fillBlock(trie->data+block, 0, rest, value, initialValue, overwrite);
    }

    return TRUE;
}